

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O1

Abc_Cex_t * Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  bool bVar5;
  Abc_Cex_t *pAVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  if (pCex->nRegs < 1) {
    __assert_fail("pCex->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x137,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar12 = 0;
  pAVar6 = Abc_CexAlloc(0,p->vCis->nSize,pCex->iFrame + 1);
  pAVar6->iFrame = pCex->iFrame;
  pAVar6->iPo = pCex->iPo;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  iVar11 = p->nRegs;
  if (0 < iVar11) {
    uVar15 = 0;
    do {
      iVar10 = p->vCos->nSize;
      uVar14 = (iVar10 - iVar11) + uVar15;
      if (((int)uVar14 < 0) || (iVar10 <= (int)uVar14)) goto LAB_006d8697;
      iVar11 = p->vCos->pArray[uVar14];
      lVar13 = (long)iVar11;
      if ((lVar13 < 0) || (p->nObjs <= iVar11)) goto LAB_006d8678;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) {
        uVar12 = (ulong)uVar15;
        break;
      }
      uVar14 = uVar15 + 1;
      uVar12 = (ulong)uVar14;
      *(ulong *)(pGVar3 + lVar13) =
           *(ulong *)(pGVar3 + lVar13) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar15 >> 5] >> ((byte)uVar15 & 0x1f) & 1) << 0x1e);
      iVar11 = p->nRegs;
      uVar15 = uVar14;
    } while ((int)uVar14 < iVar11);
  }
  iVar11 = (int)uVar12;
  if (iVar11 != pCex->nRegs) {
    __assert_fail("iBit == pCex->nRegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x141,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  if (-1 < pCex->iFrame) {
    iVar10 = 0;
    do {
      pVVar9 = p->vCis;
      uVar16 = (ulong)(uint)pVVar9->nSize;
      if (p->nRegs < pVVar9->nSize) {
        lVar13 = 0;
        do {
          if ((int)uVar16 <= lVar13) goto LAB_006d8697;
          lVar17 = (long)pVVar9->pArray[lVar13];
          if ((lVar17 < 0) || (p->nObjs <= pVVar9->pArray[lVar13])) goto LAB_006d8678;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar3 + lVar17) =
               *(ulong *)(pGVar3 + lVar17) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)(uVar12 + lVar13) >> 5] >>
                        ((byte)(uVar12 + lVar13) & 0x1f) & 1) << 0x1e);
          lVar13 = lVar13 + 1;
          pVVar9 = p->vCis;
          uVar16 = (ulong)pVVar9->nSize;
        } while (lVar13 < (long)(uVar16 - (long)p->nRegs));
        uVar12 = (ulong)(uint)((int)uVar12 + (int)lVar13);
      }
      iVar11 = (int)uVar12;
      iVar8 = p->nRegs;
      if (0 < iVar8) {
        iVar7 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar15 = (iVar1 - iVar8) + iVar7;
          if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) goto LAB_006d8697;
          iVar1 = p->vCos->pArray[uVar15];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_006d8678;
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar15 = (iVar2 - iVar8) + iVar7;
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_006d8697;
          iVar8 = p->vCis->pArray[uVar15];
          lVar13 = (long)iVar8;
          if ((lVar13 < 0) || (p->nObjs <= iVar8)) goto LAB_006d8678;
          *(ulong *)(pGVar3 + lVar13) =
               *(ulong *)(pGVar3 + lVar13) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar3 + iVar1) & 0x40000000);
          iVar7 = iVar7 + 1;
          iVar8 = p->nRegs;
        } while (iVar7 < iVar8);
      }
      pVVar9 = p->vCis;
      if (0 < pVVar9->nSize) {
        piVar4 = pVVar9->pArray;
        lVar13 = 0;
        do {
          iVar8 = piVar4[lVar13];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_006d8678;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if ((p->pObjs[iVar8].field_0x3 & 0x40) != 0) {
            iVar8 = pAVar6->nPis * iVar10 + (int)lVar13;
            (&pAVar6[1].iPo)[iVar8 >> 5] = (&pAVar6[1].iPo)[iVar8 >> 5] | 1 << ((byte)iVar8 & 0x1f);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < pVVar9->nSize);
      }
      if (0 < p->nObjs) {
        lVar13 = 0;
        lVar17 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar16 = *(ulong *)(&pGVar3->field_0x0 + lVar13);
          if ((uVar16 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar16) {
            *(ulong *)(&pGVar3->field_0x0 + lVar13) =
                 uVar16 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar16 >> 0x3d) ^
                          *(uint *)((long)pGVar3 +
                                   (ulong)((uint)(uVar16 >> 0x1e) & 0x7ffffffc) * -3 + lVar13) >>
                          0x1e) & ((uint)(uVar16 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar3 +
                                           (ulong)(uint)((int)(uVar16 & 0x1fffffff) << 2) * -3 +
                                           lVar13) >> 0x1e) & 1) << 0x1e);
          }
          lVar17 = lVar17 + 1;
          lVar13 = lVar13 + 0xc;
        } while (lVar17 < p->nObjs);
      }
      pVVar9 = p->vCos;
      if (0 < pVVar9->nSize) {
        lVar13 = 0;
        do {
          iVar8 = pVVar9->pArray[lVar13];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_006d8678;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar8;
          uVar15 = (uint)*(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               *(ulong *)pGVar3 & 0xffffffffbfffffff |
               (ulong)((uVar15 * 2 ^ *(uint *)(pGVar3 + -(ulong)(uVar15 & 0x1fffffff))) & 0x40000000
                      );
          lVar13 = lVar13 + 1;
          pVVar9 = p->vCos;
        } while (lVar13 < pVVar9->nSize);
      }
      bVar5 = iVar10 < pCex->iFrame;
      iVar10 = iVar10 + 1;
    } while (bVar5);
  }
  if (iVar11 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                  ,0x150,
                  "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)");
  }
  uVar15 = pCex->iPo;
  iVar11 = p->vCos->nSize;
  if (iVar11 - p->nRegs <= (int)uVar15) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1d0,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar15) && ((int)uVar15 < iVar11)) {
    iVar11 = p->vCos->pArray[uVar15];
    if ((-1 < (long)iVar11) && (iVar11 < p->nObjs)) {
      if ((p->pObjs[iVar11].field_0x3 & 0x40) == 0) {
        __assert_fail("Gia_ManPo(p, pCex->iPo)->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCex.c"
                      ,0x151,
                      "Abc_Cex_t *Gia_ManCexExtendToIncludeCurrentStates(Gia_Man_t *, Abc_Cex_t *)")
        ;
      }
      Gia_ManCleanMark0(p);
      return pAVar6;
    }
LAB_006d8678:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                  ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_006d8697:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Abc_Cex_t * Gia_ManCexExtendToIncludeCurrentStates( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0;
    assert( pCex->nRegs > 0 );
    // start the counter-example
    pNew = Abc_CexAlloc( 0, Gia_ManCiNum(p), pCex->iFrame + 1 );
    pNew->iFrame = pCex->iFrame;
    pNew->iPo    = pCex->iPo;
    // set const0
    Gia_ManConst0(p)->fMark0 = 0;
    // set init state
    Gia_ManForEachRi( p, pObjRi, k )
        pObjRi->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    assert( iBit == pCex->nRegs );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
        Gia_ManForEachCi( p, pObj, k )
            if ( pObj->fMark0 )
                Abc_InfoSetBit( pNew->pData, pNew->nPis * i + k );
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    }
    assert( iBit == pCex->nBits );
    assert( Gia_ManPo(p, pCex->iPo)->fMark0 == 1 );
    Gia_ManCleanMark0(p);
    return pNew;
}